

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void handle_control_message(char *msg,char *arg)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  
  iVar1 = strcmp(in_RDI,"start");
  if (iVar1 == 0) {
    msg_start(unaff_retaddr);
  }
  else {
    iVar1 = strcmp(in_RDI,"stop");
    if (iVar1 == 0) {
      msg_stop(in_RSI);
    }
    else {
      log_write(3,"<3>init: unknown control msg \'%s\'\n",in_RDI);
    }
  }
  return;
}

Assistant:

void handle_control_message(const char *msg, const char *arg)
{
    if (!strcmp(msg,"start")) {
        msg_start(arg);
    } else if (!strcmp(msg,"stop")) {
        msg_stop(arg);
    } else {
        ERROR("unknown control msg '%s'\n", msg);
    }
}